

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLNodeLinOp::getSolvabilityOffset
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MLNodeLinOp *this,
          int amrlev,int mglev,Any *a_rhs)

{
  Array4<const_double> *pAVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  FabArray<amrex::FArrayBox> *this_00;
  MultiArray4<const_double> MVar5;
  MultiArray4<const_double> MVar6;
  int *piVar7;
  Array4<const_double> *pAVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  FabArray<amrex::FArrayBox> *this_01;
  initializer_list<std::reference_wrapper<double>_> __l;
  initializer_list<double> __l_00;
  Type TVar12;
  ReduceOps<amrex::ReduceOpSum,_amrex::ReduceOpSum> reduce_op;
  IntVect local_114;
  Real s2;
  BATType local_100;
  undefined1 local_fc [28];
  MFIter mfi;
  Real s1;
  _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
  local_48;
  
  local_fc._20_8_ = __return_storage_ptr__;
  this_00 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
  this_01 = &(this->m_bottom_dot_mask).super_FabArray<amrex::FArrayBox>;
  if (mglev + 1 !=
      *(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    this_01 = &(this->m_coarse_dot_mask).super_FabArray<amrex::FArrayBox>;
  }
  MVar5 = FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>(this_01);
  MVar6 = FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>(this_00);
  local_114.vect[0] = 0;
  local_114.vect[1] = 0;
  local_114.vect[2] = 0;
  ReduceData<double,double>::ReduceData<amrex::ReduceOpSum,amrex::ReduceOpSum>
            ((ReduceData<double,double> *)&s1,&reduce_op);
  MFIter::MFIter(&mfi,&this_00->super_FabArrayBase,true);
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox((Box *)&s2,&mfi,&local_114);
    piVar7 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    pAVar1 = MVar5.hp + *piVar7;
    pAVar8 = MVar6.hp + *piVar7;
    for (lVar11 = (long)(int)local_100; lVar10 = (long)s2._4_4_, (int)lVar11 <= (int)local_fc._8_4_;
        lVar11 = lVar11 + 1) {
      for (; lVar9 = (long)s2._0_4_, (int)lVar10 <= (int)local_fc._4_4_; lVar10 = lVar10 + 1) {
        for (; (int)lVar9 <= (int)local_fc._0_4_; lVar9 = lVar9 + 1) {
          dVar2 = pAVar1->p[((lVar11 - (pAVar1->begin).z) * pAVar1->kstride +
                            (lVar10 - (pAVar1->begin).y) * pAVar1->jstride + lVar9) -
                            (long)(pAVar1->begin).x];
          dVar3 = pAVar8->p[((lVar10 - (pAVar8->begin).y) * pAVar8->jstride +
                            (lVar11 - (pAVar8->begin).z) * pAVar8->kstride + lVar9) -
                            (long)(pAVar8->begin).x];
          *(double *)s1 = dVar2 + *(double *)s1;
          *(double *)((long)s1 + 8) = dVar3 * dVar2 + *(double *)((long)s1 + 8);
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  TVar12 = ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum>::value<amrex::ReduceData<double,double>>
                     ((ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum> *)&reduce_op,
                      (ReduceData<double,_double> *)&s1);
  ReduceData<double,_double>::~ReduceData((ReduceData<double,_double> *)&s1);
  mfi.fabArray = (FabArrayBase *)&s2;
  __l._M_len = 2;
  __l._M_array = (iterator)&mfi;
  s2 = (Real)TVar12.super_gpu_tuple_impl<0UL,_double,_double>.super_gpu_tuple_impl<1UL,_double>.
             super_gpu_tuple_element<1UL,_double>.m_value.super_gpu_tuple_element<1UL,_double>;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &s1;
  s1 = TVar12.super_gpu_tuple_impl<0UL,_double,_double>.super_gpu_tuple_element<0UL,_double>.m_value
       .m_value;
  std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
  vector((vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_> *
         )&local_48,__l,(allocator_type *)&local_114);
  std::
  _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
  ~_Vector_base(&local_48);
  uVar4 = local_fc._20_8_;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (s1 / s2);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&mfi;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_fc._20_8_,__l_00,
             (allocator_type *)&local_114);
  return (Vector<double,_std::allocator<double>_> *)(vector<double,_std::allocator<double>_> *)uVar4
  ;
}

Assistant:

Vector<Real>
MLNodeLinOp::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0 && (mglev+1==m_num_mg_levels[0] || mglev==0));
    AMREX_ASSERT(getNComp() == 1);

    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto const& rhs = a_rhs.get<MultiFab>();

    const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
    const auto& mask_ma = mask.const_arrays();
    const auto& rhs_ma = rhs.const_arrays();
    auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                       rhs, IntVect(0),
                       [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                           -> GpuTuple<Real,Real>
                       {
                           return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                    mask_ma[box_no](i,j,k) };
                       });

    Real s1 = amrex::get<0>(r);
    Real s2 = amrex::get<1>(r);
    ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
    return {s1/s2};
}